

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManSetOutputRequireds(Nf_Man_t *p,int fPropCompl)

{
  uint uVar1;
  Vec_Flt_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Scl_Con_t *pSVar6;
  Gia_Obj_t *pGVar7;
  Nf_Mat_t *pNVar8;
  Jf_Par_t *pJVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  
  iVar12 = p->pPars->MapDelay;
  iVar2 = Scl_ConIsRunning();
  uVar11 = 0;
  bVar14 = false;
  if (iVar2 != 0) {
    pSVar6 = Scl_ConReadMan();
    uVar1 = (pSVar6->vOutReqs).nSize;
    uVar10 = 0;
    if (0 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      uVar11 = uVar11 + ((pSVar6->vOutReqs).pArray[uVar13] == 0);
    }
    bVar14 = uVar11 != uVar1;
  }
  Vec_IntFill(&p->vRequired,p->pGia->nObjs * 2,0x3fffffff);
  pJVar9 = p->pPars;
  pJVar9->MapDelay = 0;
  iVar2 = 0;
  do {
    if (p->pGia->vCos->nSize <= iVar2) {
LAB_0060cc60:
      if (((p->Iter != 0) && (iVar12 < pJVar9->MapDelay)) && (p->pGia->vOutReqs == (Vec_Flt_t *)0x0)
         ) {
        printf("******** Critical delay violation %.2f -> %.2f ********\n",
               (double)((float)iVar12 / 1000.0));
        pJVar9 = p->pPars;
      }
      if (iVar12 < pJVar9->MapDelay) {
        iVar12 = pJVar9->MapDelay;
      }
      pJVar9->MapDelay = iVar12;
      fVar15 = pJVar9->MapDelayTarget;
      if (((fVar15 == 0.0) && (!NAN(fVar15))) && (pJVar9->nRelaxRatio != 0)) {
        fVar15 = (float)(((pJVar9->nRelaxRatio + 100) * iVar12) / 100);
        pJVar9->MapDelayTarget = fVar15;
      }
      if (0.0 < fVar15) {
        if (fVar15 <= (float)iVar12) {
          if (pJVar9->nRelaxRatio == 0) {
            Abc_Print(0,"Relaxing user-specified delay target from %.2f to %.2f.\n",
                      (double)((float)(int)fVar15 / 1000.0),(double)((float)iVar12 / 1000.0));
          }
        }
        else {
          pJVar9->MapDelay = (int)fVar15;
        }
      }
      iVar12 = 0;
      while( true ) {
        if (p->pGia->vCos->nSize <= iVar12) {
          return;
        }
        pGVar7 = Gia_ManCo(p->pGia,iVar12);
        if (pGVar7 == (Gia_Obj_t *)0x0) break;
        iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar7);
        uVar11 = *(uint *)pGVar7 >> 0x1d & 1;
        pJVar9 = p->pPars;
        if (pJVar9->fDoAverage == 0) {
          iVar3 = pJVar9->MapDelay;
        }
        else {
          iVar3 = ((pJVar9->nRelaxRatio + 100) *
                  *(int *)((long)&p->pNfObjs[iVar2].M[0][0].D + (ulong)(uVar11 << 5))) / 100;
        }
        iVar5 = iVar3;
        if (bVar14) {
          iVar4 = Scl_ConGetOutReq(iVar12);
          if ((0 < iVar4) && (iVar4 = Scl_ConGetOutReq(iVar12), iVar3 <= iVar4)) {
            iVar5 = Scl_ConGetOutReq(iVar12);
          }
        }
        else {
          p_00 = p->pGia->vOutReqs;
          if (p_00 != (Vec_Flt_t *)0x0) {
            fVar15 = Vec_FltEntry(p_00,iVar12);
            iVar4 = (int)(fVar15 * 1000.0);
            if (((0 < iVar4) && (iVar3 <= iVar4)) && (iVar5 = iVar3 * 2, iVar4 <= iVar3 * 2)) {
              iVar5 = iVar4;
            }
          }
        }
        Nf_ObjUpdateRequired(p,iVar2,uVar11,iVar5);
        if ((0 < iVar2 && fPropCompl != 0) &&
           (pNVar8 = Nf_ObjMatchBest(p,iVar2,uVar11), (pNVar8->field_0x3 & 0x40) != 0)) {
          Nf_ObjUpdateRequired(p,iVar2,uVar11 ^ 1,iVar5 - p->InvDelayI);
        }
        iVar12 = iVar12 + 1;
      }
      return;
    }
    pGVar7 = Gia_ManCo(p->pGia,iVar2);
    if (pGVar7 == (Gia_Obj_t *)0x0) {
      pJVar9 = p->pPars;
      goto LAB_0060cc60;
    }
    iVar3 = Gia_ObjFaninId0p(p->pGia,pGVar7);
    iVar3 = *(int *)((long)&p->pNfObjs[iVar3].M[0][0].D + (ulong)(*(uint *)pGVar7 >> 0x18 & 0x20));
    pJVar9 = p->pPars;
    if (iVar3 < pJVar9->MapDelay) {
      iVar3 = pJVar9->MapDelay;
    }
    pJVar9->MapDelay = iVar3;
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Nf_ManSetOutputRequireds( Nf_Man_t * p, int fPropCompl )
{
    Gia_Obj_t * pObj;
    int Required = 0, MapDelayOld = p->pPars->MapDelay;
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    int i, iObj, fCompl, nLits = 2*Gia_ManObjNum(p->pGia);
    Vec_IntFill( &p->vRequired, nLits, SCL_INFINITY );
    // compute delay
    p->pPars->MapDelay = 0;
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Required = Nf_ObjMatchD( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj) )->D;
        p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, Required );
    }
    if ( p->Iter && MapDelayOld < p->pPars->MapDelay && p->pGia->vOutReqs == NULL )
        printf( "******** Critical delay violation %.2f -> %.2f ********\n", Scl_Int2Flt(MapDelayOld), Scl_Int2Flt(p->pPars->MapDelay) ); 
    p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, MapDelayOld );
    // check delay target
    if ( p->pPars->MapDelayTarget == 0 && p->pPars->nRelaxRatio )
        p->pPars->MapDelayTarget = p->pPars->MapDelay * (100 + p->pPars->nRelaxRatio) / 100;
    if ( p->pPars->MapDelayTarget > 0 )
    {
        if ( p->pPars->MapDelay < p->pPars->MapDelayTarget )
            p->pPars->MapDelay = p->pPars->MapDelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %.2f to %.2f.\n", Scl_Int2Flt(p->pPars->MapDelayTarget), Scl_Int2Flt(p->pPars->MapDelay) );
    }
    //assert( p->pPars->MapDelayTarget == 0 );
    // set required times
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj     = Gia_ObjFaninId0p(p->pGia, pObj);
        fCompl   = Gia_ObjFaninC0(pObj);
        Required = Nf_ObjMatchD(p, iObj, fCompl)->D;
        Required = p->pPars->fDoAverage ? Required * (100 + p->pPars->nRelaxRatio) / 100 : p->pPars->MapDelay;
        // if external required time can be achieved, use it
        if ( fUseConMan )
        {
            if ( Scl_ConGetOutReq(i) > 0 && Required <= Scl_ConGetOutReq(i) )
                Required = Scl_ConGetOutReq(i);
        }
        else if ( p->pGia->vOutReqs )
        {
            int NewRequired = Scl_Flt2Int(Vec_FltEntry(p->pGia->vOutReqs, i));
            if ( NewRequired > 0 && Required <= NewRequired )
                Required = Abc_MinInt( 2*Required, NewRequired );
        }
        // if external required cannot be achieved, set the earliest possible arrival time
//        else if ( p->pGia->vOutReqs && Vec_FltEntry(p->pGia->vOutReqs, i) > 0 && Required > Vec_FltEntry(p->pGia->vOutReqs, i) )
//            ptTime->Rise = ptTime->Fall = ptTime->Worst = Required;
        // otherwise, set the global required time
        Nf_ObjUpdateRequired( p, iObj, fCompl, Required );
        if ( fPropCompl && iObj > 0 && Nf_ObjMatchBest(p, iObj, fCompl)->fCompl )
            Nf_ObjUpdateRequired( p, iObj, !fCompl, Required - p->InvDelayI );
        //Nf_ObjMapRefInc( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj));
    }
}